

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

void llb_build_key_get_target_name(llb_build_key_t *key,llb_data_t *out_name)

{
  uint8_t *puVar1;
  StringRef name;
  StringRef local_40;
  string local_30;
  
  local_40 = llbuild::buildsystem::BuildKey::getTargetName((BuildKey *)(key + 0x10));
  out_name->length = local_40.Length;
  llvm::StringRef::str_abi_cxx11_(&local_30,&local_40);
  puVar1 = (uint8_t *)strdup(local_30._M_dataplus._M_p);
  out_name->data = puVar1;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void llb_build_key_get_target_name(llb_build_key_t *key, llb_data_t *out_name) {
  auto name = ((CAPIBuildKey *)key)->getInternalBuildKey().getTargetName();
  out_name->length = name.size();
  out_name->data = (const uint8_t*)strdup(name.str().c_str());
}